

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_gen_prime
              (mbedtls_mpi *X,size_t nbits,int flags,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  ulong *puVar1;
  ulong uVar2;
  uint rounds;
  void *p_rng_00;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_00;
  int iVar3;
  long lVar4;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi _B;
  mbedtls_mpi Y;
  mbedtls_mpi_uint r;
  mbedtls_mpi_uint local_90;
  void *local_88;
  _func_int_void_ptr_uchar_ptr_size_t *local_80;
  uint local_74;
  mbedtls_mpi local_70;
  size_t local_58;
  mbedtls_mpi local_50;
  mbedtls_mpi_uint local_38;
  
  if (nbits - 0x2001 < 0xffffffffffffe002) {
    return -4;
  }
  local_50.s = 1;
  local_50.n = 0;
  local_50.p = (mbedtls_mpi_uint *)0x0;
  lVar4 = ((nbits >> 6) + 1) - (ulong)((nbits & 0x3f) == 0);
  if ((flags & 2U) == 0) {
    rounds = 2;
    if (((nbits < 0x514) && (rounds = 3, nbits < 0x352)) &&
       ((rounds = 4, nbits < 0x28a && ((rounds = 8, nbits < 0x15e && (rounds = 0xc, nbits < 0xfa))))
       )) {
      rounds = (uint)(nbits < 0x96) * 9 + 0x12;
    }
  }
  else {
    rounds = 4;
    if ((((nbits < 0x5aa) && (rounds = 5, nbits < 0x47e)) && (rounds = 6, nbits < 1000)) &&
       (((rounds = 7, nbits < 0x352 && (rounds = 8, nbits < 0x2ee)) &&
        ((rounds = 0xd, nbits < 500 && (rounds = 0x1c, nbits < 0xfa)))))) {
      rounds = 0x33;
      if (0x95 < nbits) {
        rounds = 0x28;
      }
    }
  }
  local_80 = f_rng;
  local_74 = flags;
  iVar3 = mbedtls_mpi_fill_random(X,lVar4 * 8,f_rng,p_rng);
  if (iVar3 == 0) {
    local_58 = lVar4 * 0x40 - nbits;
    local_88 = p_rng;
    do {
      if (0xb504f333f9de6484 < X->p[lVar4 + -1]) {
        if ((nbits < (ulong)(lVar4 * 0x40)) && (iVar3 = mbedtls_mpi_shift_r(X,local_58), iVar3 != 0)
           ) break;
        puVar1 = X->p;
        uVar2 = *puVar1;
        *puVar1 = uVar2 | 1;
        if ((local_74 & 1) != 0) {
          *puVar1 = uVar2 | 3;
          iVar3 = mbedtls_mpi_mod_int(&local_38,X,3);
          if (iVar3 != 0) break;
          if (local_38 == 1) {
            local_90 = 4;
LAB_001271e4:
            local_70.p = &local_90;
            local_70.s = 1;
            local_70.n = 1;
            iVar3 = mbedtls_mpi_add_mpi(X,X,&local_70);
            if (iVar3 != 0) break;
          }
          else if (local_38 == 0) {
            local_90 = 8;
            goto LAB_001271e4;
          }
          iVar3 = mbedtls_mpi_copy(&local_50,X);
          if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_shift_r(&local_50,1), iVar3 == 0)) {
            goto LAB_00127248;
          }
          break;
        }
        iVar3 = mbedtls_mpi_is_prime_ext(X,rounds,local_80,local_88);
        if (iVar3 != -0xe) break;
      }
      iVar3 = mbedtls_mpi_fill_random(X,lVar4 * 8,local_80,local_88);
    } while (iVar3 == 0);
  }
  goto LAB_0012719f;
  while( true ) {
    local_90 = 0xc;
    local_70.s = 1;
    local_70.n = 1;
    local_70.p = &local_90;
    iVar3 = mbedtls_mpi_add_mpi(X,X,&local_70);
    if (iVar3 != 0) break;
    local_90 = 6;
    local_70.s = 1;
    local_70.n = 1;
    local_70.p = &local_90;
    iVar3 = mbedtls_mpi_add_mpi(&local_50,&local_50,&local_70);
    if (iVar3 != 0) break;
LAB_00127248:
    iVar3 = mpi_check_small_factors(X);
    if (((iVar3 == 0) &&
        (iVar3 = mpi_check_small_factors(&local_50), f_rng_00 = local_80, p_rng_00 = local_88,
        iVar3 == 0)) && (iVar3 = mpi_miller_rabin(X,(ulong)rounds,local_80,local_88), iVar3 == 0)) {
      iVar3 = mpi_miller_rabin(&local_50,(ulong)rounds,f_rng_00,p_rng_00);
    }
    if (iVar3 != -0xe) break;
  }
LAB_0012719f:
  mbedtls_mpi_free(&local_50);
  return iVar3;
}

Assistant:

int mbedtls_mpi_gen_prime( mbedtls_mpi *X, size_t nbits, int flags,
                   int (*f_rng)(void *, unsigned char *, size_t),
                   void *p_rng )
{
#ifdef MBEDTLS_HAVE_INT64
// ceil(2^63.5)
#define CEIL_MAXUINT_DIV_SQRT2 0xb504f333f9de6485ULL
#else
// ceil(2^31.5)
#define CEIL_MAXUINT_DIV_SQRT2 0xb504f334U
#endif
    int ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
    size_t k, n;
    int rounds;
    mbedtls_mpi_uint r;
    mbedtls_mpi Y;

    MPI_VALIDATE_RET( X     != NULL );
    MPI_VALIDATE_RET( f_rng != NULL );

    if( nbits < 3 || nbits > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &Y );

    n = BITS_TO_LIMBS( nbits );

    if( ( flags & MBEDTLS_MPI_GEN_PRIME_FLAG_LOW_ERR ) == 0 )
    {
        /*
         * 2^-80 error probability, number of rounds chosen per HAC, table 4.4
         */
        rounds = ( ( nbits >= 1300 ) ?  2 : ( nbits >=  850 ) ?  3 :
                   ( nbits >=  650 ) ?  4 : ( nbits >=  350 ) ?  8 :
                   ( nbits >=  250 ) ? 12 : ( nbits >=  150 ) ? 18 : 27 );
    }
    else
    {
        /*
         * 2^-100 error probability, number of rounds computed based on HAC,
         * fact 4.48
         */
        rounds = ( ( nbits >= 1450 ) ?  4 : ( nbits >=  1150 ) ?  5 :
                   ( nbits >= 1000 ) ?  6 : ( nbits >=   850 ) ?  7 :
                   ( nbits >=  750 ) ?  8 : ( nbits >=   500 ) ? 13 :
                   ( nbits >=  250 ) ? 28 : ( nbits >=   150 ) ? 40 : 51 );
    }

    while( 1 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( X, n * ciL, f_rng, p_rng ) );
        /* make sure generated number is at least (nbits-1)+0.5 bits (FIPS 186-4 §B.3.3 steps 4.4, 5.5) */
        if( X->p[n-1] < CEIL_MAXUINT_DIV_SQRT2 ) continue;

        k = n * biL;
        if( k > nbits ) MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( X, k - nbits ) );
        X->p[0] |= 1;

        if( ( flags & MBEDTLS_MPI_GEN_PRIME_FLAG_DH ) == 0 )
        {
            ret = mbedtls_mpi_is_prime_ext( X, rounds, f_rng, p_rng );

            if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                goto cleanup;
        }
        else
        {
            /*
             * An necessary condition for Y and X = 2Y + 1 to be prime
             * is X = 2 mod 3 (which is equivalent to Y = 2 mod 3).
             * Make sure it is satisfied, while keeping X = 3 mod 4
             */

            X->p[0] |= 2;

            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, 3 ) );
            if( r == 0 )
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 8 ) );
            else if( r == 1 )
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( X, X, 4 ) );

            /* Set Y = (X-1) / 2, which is X / 2 because X is odd */
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, X ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, 1 ) );

            while( 1 )
            {
                /*
                 * First, check small factors for X and Y
                 * before doing Miller-Rabin on any of them
                 */
                if( ( ret = mpi_check_small_factors(  X         ) ) == 0 &&
                    ( ret = mpi_check_small_factors( &Y         ) ) == 0 &&
                    ( ret = mpi_miller_rabin(  X, rounds, f_rng, p_rng  ) )
                                                                    == 0 &&
                    ( ret = mpi_miller_rabin( &Y, rounds, f_rng, p_rng  ) )
                                                                    == 0 )
                    goto cleanup;

                if( ret != MBEDTLS_ERR_MPI_NOT_ACCEPTABLE )
                    goto cleanup;

                /*
                 * Next candidates. We want to preserve Y = (X-1) / 2 and
                 * Y = 1 mod 2 and Y = 2 mod 3 (eq X = 3 mod 4 and X = 2 mod 3)
                 * so up Y by 6 and X by 12.
                 */
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int(  X,  X, 12 ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &Y, &Y, 6  ) );
            }
        }
    }

cleanup:

    mbedtls_mpi_free( &Y );

    return( ret );
}